

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O2

void dfs(int u)

{
  int *piVar1;
  int in_EDI;
  int *piVar2;
  reference rVar3;
  int local_24;
  
  local_24 = in_EDI;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,
                     (long)in_EDI);
  *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::comp,&local_24);
  piVar1 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_24].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar2 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_24].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,
                       (long)*piVar2);
    if ((*rVar3._M_p & rVar3._M_mask) == 0) {
      dfs(0);
    }
  }
  return;
}

Assistant:

void dfs(int u) {
    useddfs[u] = true;
    comp.push_back(u);
    for (int i : edge[u])
        if (!useddfs[i])
            dfs(i);
}